

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O2

void __thiscall
glu::FboRenderContext::FboRenderContext
          (FboRenderContext *this,ContextFactory *factory,RenderConfig *config,CommandLine *cmdLine)

{
  int iVar1;
  undefined4 extraout_var;
  ApiType local_60;
  undefined8 local_5c;
  undefined4 local_54;
  Visibility local_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__FboRenderContext_00c24268;
  this->m_context = (RenderContext *)0x0;
  this->m_framebuffer = 0;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  tcu::RenderTarget::RenderTarget(&this->m_renderTarget);
  local_5c = 0xffffffffffffffff;
  local_54 = 0;
  local_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  local_3c = 0xffffffff;
  uStack_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  local_2c = 0;
  local_60.m_bits = (config->type).super_ApiType.m_bits;
  local_50 = config->windowVisibility;
  iVar1 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                    (factory,&local_60,cmdLine);
  this->m_context = (RenderContext *)CONCAT44(extraout_var,iVar1);
  createFramebuffer(this,config);
  return;
}

Assistant:

FboRenderContext::FboRenderContext (const ContextFactory& factory, const RenderConfig& config, const tcu::CommandLine& cmdLine)
	: m_context				(DE_NULL)
	, m_framebuffer			(0)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
	, m_renderTarget		()
{
	try
	{
		RenderConfig nativeRenderConfig;
		nativeRenderConfig.type				= config.type;
		nativeRenderConfig.windowVisibility	= config.windowVisibility;
		// \note All other properties are defaults, mostly DONT_CARE
		m_context = factory.createContext(nativeRenderConfig, cmdLine);
		createFramebuffer(config);
	}
	catch (...)
	{
		delete m_context;
		throw;
	}
}